

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  BYTE *iEnd;
  long *iStart;
  long *plVar1;
  U32 hBits;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  BYTE *pBVar8;
  uint uVar9;
  size_t sVar10;
  BYTE *pBVar11;
  long lVar12;
  size_t sVar13;
  byte bVar14;
  uint uVar15;
  long *plVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  U32 UVar20;
  ulong uVar21;
  ulong uVar22;
  U32 UVar23;
  long *literals;
  long *plVar24;
  long *plVar25;
  long *plVar26;
  U32 local_c8;
  U32 local_c4;
  
  pUVar5 = ms->hashTable;
  pUVar6 = ms->chainTable;
  hBits = (ms->cParams).chainLog;
  iEnd = (BYTE *)((long)src + srcSize);
  plVar1 = (long *)((long)src + (srcSize - 8));
  uVar2 = (ms->window).dictLimit;
  pBVar7 = (ms->window).base;
  pBVar8 = (ms->window).dictBase;
  uVar3 = (ms->window).lowLimit;
  bVar14 = 0x40 - (char)(ms->cParams).hashLog;
  plVar16 = (long *)(pBVar8 + uVar3);
  pBVar17 = pBVar8 + uVar2;
  iStart = (long *)(pBVar7 + uVar2);
  local_c4 = *rep;
  local_c8 = rep[1];
  literals = (long *)src;
LAB_003b9ace:
  do {
    if (plVar1 <= src) {
      *rep = local_c4;
      rep[1] = local_c8;
      return (long)iEnd - (long)literals;
    }
    sVar10 = ZSTD_hashPtr(src,hBits,mls);
    uVar9 = pUVar6[sVar10];
    pBVar18 = pBVar8;
    if (uVar2 <= uVar9) {
      pBVar18 = pBVar7;
    }
    lVar12 = *src;
    uVar22 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar14 & 0x3f);
    uVar4 = pUVar5[uVar22];
    pBVar19 = pBVar8;
    if (uVar2 <= uVar4) {
      pBVar19 = pBVar7;
    }
    uVar21 = (long)src - (long)pBVar7;
    UVar20 = (U32)uVar21;
    UVar23 = UVar20 + 1;
    uVar15 = UVar23 - local_c4;
    pUVar5[uVar22] = UVar20;
    pUVar6[sVar10] = UVar20;
    if (uVar3 < uVar15 && 2 < (uVar2 - 1) - uVar15) {
      pBVar11 = pBVar8;
      if (uVar2 <= uVar15) {
        pBVar11 = pBVar7;
      }
      if (*(int *)(pBVar11 + uVar15) != *(int *)((long)src + 1)) goto LAB_003b9b95;
      plVar24 = (long *)((long)src + 1);
      pBVar18 = iEnd;
      if (uVar15 < uVar2) {
        pBVar18 = pBVar17;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 5),pBVar11 + (ulong)uVar15 + 4,iEnd,pBVar18,
                          (BYTE *)iStart);
      lVar12 = sVar10 + 4;
      ZSTD_storeSeq(seqStore,(long)plVar24 - (long)literals,literals,0,sVar10 + 1);
    }
    else {
LAB_003b9b95:
      if ((uVar3 < uVar4) && (plVar25 = (long *)(pBVar19 + uVar4), *plVar25 == lVar12)) {
        plVar26 = iStart;
        pBVar18 = iEnd;
        if (uVar4 < uVar2) {
          plVar26 = plVar16;
          pBVar18 = pBVar17;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 8),(BYTE *)(plVar25 + 1),iEnd,pBVar18,
                            (BYTE *)iStart);
        for (lVar12 = 0;
            ((plVar24 = (long *)((long)src + lVar12), plVar26 < (long *)((long)plVar25 + lVar12) &&
             (literals < plVar24)) &&
            (*(char *)((long)src + lVar12 + -1) == *(char *)((long)plVar25 + lVar12 + -1)));
            lVar12 = lVar12 + -1) {
        }
        ZSTD_storeSeq(seqStore,(long)plVar24 - (long)literals,literals,(UVar20 - uVar4) + 2,
                      (sVar10 - lVar12) + 5);
        lVar12 = (sVar10 - lVar12) + 8;
        local_c8 = local_c4;
        local_c4 = UVar20 - uVar4;
      }
      else {
        if ((uVar9 <= uVar3) || (plVar25 = (long *)(pBVar18 + uVar9), (int)*plVar25 != (int)*src)) {
          src = (void *)((long)src + ((long)src - (long)literals >> 8) + 1);
          goto LAB_003b9ace;
        }
        lVar12 = *(long *)((long)src + 1);
        uVar22 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar14 & 0x3f);
        uVar4 = pUVar5[uVar22];
        pBVar18 = pBVar7;
        if (uVar4 < uVar2) {
          pBVar18 = pBVar8;
        }
        pUVar5[uVar22] = UVar23;
        if ((uVar3 < uVar4) && (plVar26 = (long *)(pBVar18 + uVar4), *plVar26 == lVar12)) {
          plVar24 = (long *)((long)src + 1);
          plVar25 = iStart;
          pBVar18 = iEnd;
          if (uVar4 < uVar2) {
            plVar25 = plVar16;
            pBVar18 = pBVar17;
          }
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 9),(BYTE *)(plVar26 + 1),iEnd,pBVar18,
                              (BYTE *)iStart);
          lVar12 = sVar10 + 8;
          UVar23 = UVar23 - uVar4;
          for (; ((plVar25 < plVar26 && (literals < plVar24)) &&
                 (*(BYTE *)((long)plVar24 + -1) == *(BYTE *)((long)plVar26 + -1)));
              plVar24 = (long *)((long)plVar24 + -1)) {
            plVar26 = (long *)((long)plVar26 + -1);
            lVar12 = lVar12 + 1;
          }
        }
        else {
          plVar26 = iStart;
          pBVar18 = iEnd;
          if (uVar9 < uVar2) {
            plVar26 = plVar16;
            pBVar18 = pBVar17;
          }
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 4),(BYTE *)((long)plVar25 + 4),iEnd,pBVar18,
                              (BYTE *)iStart);
          lVar12 = sVar10 + 4;
          UVar23 = UVar20 - uVar9;
          for (; ((plVar24 = (long *)src, plVar26 < plVar25 && (literals < src)) &&
                 (*(BYTE *)((long)src + -1) == *(BYTE *)((long)plVar25 + -1)));
              src = (void *)((long)src + -1)) {
            plVar25 = (long *)((long)plVar25 + -1);
            lVar12 = lVar12 + 1;
          }
        }
        ZSTD_storeSeq(seqStore,(long)plVar24 - (long)literals,literals,UVar23 + 2,lVar12 - 3);
        local_c8 = local_c4;
        local_c4 = UVar23;
      }
    }
    src = (void *)(lVar12 + (long)plVar24);
    literals = (long *)src;
    if (src <= plVar1) {
      uVar21 = uVar21 & 0xffffffff;
      sVar10 = ZSTD_hashPtr(pBVar7 + uVar21 + 2,hBits,mls);
      pUVar6[sVar10] = UVar20 + 2;
      pUVar5[(ulong)(*(long *)(pBVar7 + uVar21 + 2) * -0x30e44323485a9b9d) >> (bVar14 & 0x3f)] =
           UVar20 + 2;
      UVar20 = (int)(void *)((long)src + -2) - (int)pBVar7;
      sVar10 = ZSTD_hashPtr((void *)((long)src + -2),hBits,mls);
      pUVar6[sVar10] = UVar20;
      pUVar5[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar14 & 0x3f)] = UVar20;
      UVar20 = local_c8;
      for (; local_c8 = UVar20, literals = (long *)src, src <= plVar1;
          src = (void *)((long)src + sVar10 + 4)) {
        UVar20 = (int)src - (int)pBVar7;
        uVar9 = UVar20 - local_c8;
        pBVar18 = pBVar7;
        if (uVar9 < uVar2) {
          pBVar18 = pBVar8;
        }
        if (((uVar9 <= uVar3) || ((uVar2 - 1) - uVar9 < 3)) ||
           (*(int *)(pBVar18 + uVar9) != (int)*src)) break;
        pBVar19 = iEnd;
        if (uVar9 < uVar2) {
          pBVar19 = pBVar17;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar18 + uVar9) + 4),iEnd,
                            pBVar19,(BYTE *)iStart);
        ZSTD_storeSeq(seqStore,0,src,0,sVar10 + 1);
        sVar13 = ZSTD_hashPtr(src,hBits,mls);
        pUVar6[sVar13] = UVar20;
        pUVar5[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar14 & 0x3f)] = UVar20;
        UVar20 = local_c4;
        local_c4 = local_c8;
      }
    }
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const U32   prefixStartIndex = ms->window.dictLimit;
    const BYTE* const base = ms->window.base;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const U32   dictStartIndex = ms->window.lowLimit;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 current = (U32)(ip-base);
        const U32 repIndex = current + 1 - offset_1;   /* offset_1 expected <= current +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = current;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (repIndex > dictStartIndex))
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, ip-anchor, anchor, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = current - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = current + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = current+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = current - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* found a match : store it */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Fill Table */
            hashSmall[ZSTD_hashPtr(base+current+2, hBitsS, mls)] = current+2;
            hashLong[ZSTD_hashPtr(base+current+2, hBitsL, 8)] = current+2;
            hashSmall[ZSTD_hashPtr(ip-2, hBitsS, mls)] = (U32)(ip-2-base);
            hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (repIndex2 > dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return iend - anchor;
}